

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

string_t duckdb::UncompressedStringStorage::ReadOverflowString
                   (ColumnSegment *segment,Vector *result,block_id_t block,int32_t offset)

{
  uint string_length;
  BufferManager *pBVar1;
  BlockManager *this;
  BlockManager *manager_p;
  data_ptr_t pdVar2;
  Vector *vector;
  Vector *pVVar3;
  iterator iVar4;
  idx_t iVar5;
  data_ptr_t pdVar6;
  idx_t len;
  uint uVar7;
  int iVar9;
  Vector *__n;
  anon_union_16_2_67f50693_for_value aVar10;
  BufferHandle handle;
  anon_union_16_2_67f50693_for_value local_b8;
  BufferHandle target_handle;
  shared_ptr<duckdb::BlockHandle,_true> block_handle;
  block_id_t block_local;
  undefined1 local_78 [48];
  BufferHandle local_48;
  Vector *pVVar8;
  
  block_local = block;
  this = ColumnSegment::GetBlockManager(segment);
  pBVar1 = this->buffer_manager;
  handle.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (segment->segment_state).
         super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
         .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  manager_p = (BlockManager *)
              optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                        ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&handle);
  if (block < 0x4000000000000060) {
    UncompressedStringSegmentState::GetHandle
              ((UncompressedStringSegmentState *)&block_handle,manager_p,(block_id_t)this);
    (*pBVar1->_vptr_BufferManager[7])
              (&handle,pBVar1,(UncompressedStringSegmentState *)&block_handle);
    pdVar2 = BufferHandle::Ptr(&handle);
    string_length = *(uint *)(pdVar2 + offset);
    vector = (Vector *)(ulong)string_length;
    BufferHandle::BufferHandle(&target_handle);
    pVVar3 = (Vector *)BlockManager::GetBlockSize(this);
    if (vector < pVVar3) {
      local_b8.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString((StringVector *)result,vector,len);
      pdVar2 = local_b8._8_8_;
      if (local_b8._0_4_ < 0xd) {
        pdVar2 = (data_ptr_t)((long)&local_b8 + 4);
      }
    }
    else {
      (*pBVar1->_vptr_BufferManager[4])(local_78,pBVar1,8,vector,1);
      BufferHandle::operator=(&target_handle,(BufferHandle *)local_78);
      BufferHandle::~BufferHandle((BufferHandle *)local_78);
      pdVar2 = BufferHandle::Ptr(&target_handle);
    }
    iVar9 = offset + 4;
    pVVar8 = vector;
    while ((int)pVVar8 != 0) {
      iVar5 = BlockManager::GetBlockSize(this);
      pdVar6 = BufferHandle::Ptr(&handle);
      __n = (Vector *)((iVar5 - (long)iVar9) + -8);
      if (pVVar8 < __n) {
        __n = pVVar8;
      }
      switchD_016b0717::default(pdVar2,pdVar6 + iVar9,(size_t)__n);
      iVar9 = iVar9 + (int)__n;
      pdVar2 = pdVar2 + (long)__n;
      uVar7 = (int)pVVar8 - (int)__n;
      pVVar8 = (Vector *)(ulong)uVar7;
      if (uVar7 != 0) {
        BufferHandle::Ptr(&handle);
        UncompressedStringSegmentState::GetHandle
                  ((UncompressedStringSegmentState *)local_78,manager_p,(block_id_t)this);
        shared_ptr<duckdb::BlockHandle,_true>::operator=
                  (&block_handle,(shared_ptr<duckdb::BlockHandle,_true> *)local_78);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
        (*pBVar1->_vptr_BufferManager[7])
                  ((UncompressedStringSegmentState *)local_78,pBVar1,&block_handle);
        BufferHandle::operator=(&handle,(BufferHandle *)local_78);
        BufferHandle::~BufferHandle((BufferHandle *)local_78);
        iVar9 = 0;
      }
    }
    if (vector < pVVar3) {
      string_t::Finalize((string_t *)&local_b8.pointer);
      aVar10 = local_b8;
    }
    else {
      pdVar2 = BufferHandle::Ptr(&target_handle);
      BufferHandle::BufferHandle(&local_48,&target_handle);
      StringVector::AddHandle(result,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      aVar10.pointer = (anon_struct_16_3_d7536bce_for_pointer)ReadString(pdVar2,0,string_length);
    }
    BufferHandle::~BufferHandle(&target_handle);
    BufferHandle::~BufferHandle(&handle);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&block_handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    iVar4 = ::std::
            _Hashtable<long,_std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>,_std::allocator<std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<long,_std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>,_std::allocator<std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&manager_p->blocks_lock,&block_local);
    (*pBVar1->_vptr_BufferManager[7])
              (&handle,pBVar1,
               *(undefined8 *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>,_false>
                       ._M_cur + 0x10));
    pdVar2 = BufferHandle::Ptr(&handle);
    BufferHandle::BufferHandle((BufferHandle *)(local_78 + 0x18),&handle);
    StringVector::AddHandle(result,(BufferHandle *)(local_78 + 0x18));
    BufferHandle::~BufferHandle((BufferHandle *)(local_78 + 0x18));
    aVar10.pointer = (anon_struct_16_3_d7536bce_for_pointer)ReadStringWithLength(pdVar2,offset);
    BufferHandle::~BufferHandle(&handle);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar10.pointer;
}

Assistant:

string_t UncompressedStringStorage::ReadOverflowString(ColumnSegment &segment, Vector &result, block_id_t block,
                                                       int32_t offset) {
	auto &block_manager = segment.GetBlockManager();
	auto &buffer_manager = block_manager.buffer_manager;
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();

	D_ASSERT(block != INVALID_BLOCK);
	D_ASSERT(offset < NumericCast<int32_t>(block_manager.GetBlockSize()));

	if (block < MAXIMUM_BLOCK) {
		// read the overflow string from disk
		// pin the initial handle and read the length
		auto block_handle = state.GetHandle(block_manager, block);
		auto handle = buffer_manager.Pin(block_handle);

		// read header
		uint32_t length = Load<uint32_t>(handle.Ptr() + offset);
		uint32_t remaining = length;
		offset += sizeof(uint32_t);

		BufferHandle target_handle;
		string_t overflow_string;
		data_ptr_t target_ptr;
		bool allocate_block = length >= block_manager.GetBlockSize();
		if (allocate_block) {
			// overflow string is bigger than a block - allocate a temporary buffer for it
			target_handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, length);
			target_ptr = target_handle.Ptr();
		} else {
			// overflow string is smaller than a block - add it to the vector directly
			overflow_string = StringVector::EmptyString(result, length);
			target_ptr = data_ptr_cast(overflow_string.GetDataWriteable());
		}

		// now append the string to the single buffer
		while (remaining > 0) {
			idx_t to_write = MinValue<idx_t>(remaining, block_manager.GetBlockSize() - sizeof(block_id_t) -
			                                                UnsafeNumericCast<idx_t>(offset));
			memcpy(target_ptr, handle.Ptr() + offset, to_write);
			remaining -= to_write;
			offset += UnsafeNumericCast<int32_t>(to_write);
			target_ptr += to_write;
			if (remaining > 0) {
				// read the next block
				block_id_t next_block = Load<block_id_t>(handle.Ptr() + offset);
				block_handle = state.GetHandle(block_manager, next_block);
				handle = buffer_manager.Pin(block_handle);
				offset = 0;
			}
		}
		if (allocate_block) {
			auto final_buffer = target_handle.Ptr();
			StringVector::AddHandle(result, std::move(target_handle));
			return ReadString(final_buffer, 0, length);
		} else {
			overflow_string.Finalize();
			return overflow_string;
		}
	}

	// read the overflow string from memory
	// first pin the handle, if it is not pinned yet
	auto entry = state.overflow_blocks.find(block);
	D_ASSERT(entry != state.overflow_blocks.end());
	auto handle = buffer_manager.Pin(entry->second.get().block);
	auto final_buffer = handle.Ptr();
	StringVector::AddHandle(result, std::move(handle));
	return ReadStringWithLength(final_buffer, offset);
}